

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

Matrix * __thiscall
ANN::feed_forward(Matrix *__return_storage_ptr__,ANN *this,
                 vector<double,_std::allocator<double>_> *inputs)

{
  reference pvVar1;
  ulong uVar2;
  size_type sVar3;
  Matrix *pMVar4;
  vector<double,_std::allocator<double>_> *inputs_00;
  Matrix local_b0;
  Matrix local_90;
  Matrix local_70;
  uint local_50;
  uint i;
  undefined1 local_40 [8];
  Matrix mat;
  vector<double,_std::allocator<double>_> *inputs_local;
  ANN *this_local;
  
  mat.m_shape.field_0 = (anon_union_8_2_1e237852_for_Shape_0)inputs;
  Matrix::Matrix((Matrix *)local_40);
  pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,0);
  Layer::equalize(pvVar1,(vector<double,_std::allocator<double>_> *)mat.m_shape.field_0);
  local_50 = 1;
  while( true ) {
    uVar2 = (ulong)local_50;
    sVar3 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
    if (sVar3 <= uVar2) break;
    pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(local_50 - 1));
    Layer::outputs(&local_90,pvVar1);
    pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(local_50 - 1));
    pMVar4 = Layer::weights(pvVar1);
    Matrix::transpose(&local_b0,pMVar4);
    Matrix::operator*(&local_70,&local_90,&local_b0);
    Matrix::operator=((Matrix *)local_40,&local_70);
    Matrix::~Matrix(&local_70);
    Matrix::~Matrix(&local_b0);
    Matrix::~Matrix(&local_90);
    pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[]
                       (&this->m_layers,(ulong)(local_50 - 1));
    pMVar4 = Layer::biases(pvVar1);
    Matrix::operator+=((Matrix *)local_40,pMVar4);
    pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)local_50)
    ;
    inputs_00 = Matrix::operator[]((Matrix *)local_40,0);
    Layer::equalize(pvVar1,inputs_00);
    local_50 = local_50 + 1;
  }
  sVar3 = std::vector<Layer,_std::allocator<Layer>_>::size(&this->m_layers);
  pvVar1 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,sVar3 - 1);
  Layer::outputs(__return_storage_ptr__,pvVar1);
  Matrix::~Matrix((Matrix *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Matrix ANN::feed_forward(const std::vector<double>& inputs){
    Matrix mat;
    m_layers[0].equalize(inputs);

    for(uint i=1;i<m_layers.size();++i){
        mat=m_layers[i-1].outputs()*Matrix::transpose(m_layers[i-1].weights());
        mat+=m_layers[i-1].biases();
        m_layers[i].equalize(mat[0]);
    }

    return m_layers[m_layers.size()-1].outputs();
}